

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_png(char *filename,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  uchar *png;
  FILE *pFStack_40;
  int len;
  FILE *f;
  void *pvStack_30;
  int stride_bytes_local;
  void *data_local;
  int local_20;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  f._4_4_ = stride_bytes;
  pvStack_30 = data;
  data_local._4_4_ = comp;
  local_20 = y;
  comp_local = x;
  _y_local = filename;
  __ptr = stbi_write_png_to_mem((uchar *)data,stride_bytes,x,y,comp,(int *)((long)&png + 4));
  if (__ptr == (uchar *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    pFStack_40 = fopen(_y_local,"wb");
    if (pFStack_40 == (FILE *)0x0) {
      free(__ptr);
      filename_local._4_4_ = 0;
    }
    else {
      fwrite(__ptr,1,(long)png._4_4_,pFStack_40);
      fclose(pFStack_40);
      free(__ptr);
      filename_local._4_4_ = 1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

STBIWDEF int stbi_write_png(char const *filename, int x, int y, int comp, const void *data, int stride_bytes)
{
   FILE *f;
   int len;
   unsigned char *png = stbi_write_png_to_mem((unsigned char *) data, stride_bytes, x, y, comp, &len);
   if (png == NULL) return 0;
#ifdef STBI_MSC_SECURE_CRT
   if (fopen_s(&f, filename, "wb"))
      f = NULL;
#else
   f = fopen(filename, "wb");
#endif
   if (!f) { STBIW_FREE(png); return 0; }
   fwrite(png, 1, len, f);
   fclose(f);
   STBIW_FREE(png);
   return 1;
}